

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uresdata.cpp
# Opt level: O0

void res_load_63(ResourceData *pResData,char *path,char *name,UErrorCode *errorCode)

{
  UBool UVar1;
  UDataMemory *pUVar2;
  void *inBytes;
  uint8_t local_2c [4];
  UErrorCode *pUStack_28;
  UVersionInfo formatVersion;
  UErrorCode *errorCode_local;
  char *name_local;
  char *path_local;
  ResourceData *pResData_local;
  
  pUStack_28 = errorCode;
  memset(pResData,0,0x40);
  pUVar2 = udata_openChoice_63(path,"res",name,isAcceptable,local_2c,pUStack_28);
  pResData->data = pUVar2;
  UVar1 = U_FAILURE(*pUStack_28);
  if (UVar1 == '\0') {
    inBytes = udata_getMemory_63(pResData->data);
    res_init(pResData,local_2c,inBytes,-1,pUStack_28);
  }
  return;
}

Assistant:

U_CFUNC void
res_load(ResourceData *pResData,
         const char *path, const char *name, UErrorCode *errorCode) {
    UVersionInfo formatVersion;

    uprv_memset(pResData, 0, sizeof(ResourceData));

    /* load the ResourceBundle file */
    pResData->data=udata_openChoice(path, "res", name, isAcceptable, formatVersion, errorCode);
    if(U_FAILURE(*errorCode)) {
        return;
    }

    /* get its memory and initialize *pResData */
    res_init(pResData, formatVersion, udata_getMemory(pResData->data), -1, errorCode);
}